

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlbinary.c
# Opt level: O3

err_t RenderData(ebml_master *Element,stream *Output,bool_t bForceWithoutMandatory,
                bool_t bWithDefault,int ForProfile,filepos_t *Rendered)

{
  code *pcVar1;
  bool_t bVar2;
  bool_t bVar3;
  ebml_context *Context;
  ebml_crc *peVar4;
  long lVar5;
  err_t eVar6;
  filepos_t fVar7;
  stream *Output_00;
  size_t *Rendered_00;
  filepos_t CrcSize;
  uint8_t *Data;
  size_t Written;
  filepos_t _Rendered;
  long local_78;
  bool_t local_70;
  array local_68;
  ebml_crc *local_50;
  long local_48;
  size_t local_40;
  size_t local_38;
  
  Rendered_00 = &local_38;
  if (Rendered != (filepos_t *)0x0) {
    Rendered_00 = (size_t *)Rendered;
  }
  *Rendered_00 = 0;
  if ((bForceWithoutMandatory == 0) &&
     (bVar2 = CheckMandatory(Element,bWithDefault,ForProfile), bVar2 == 0)) {
    __assert_fail("CheckMandatory((ebml_master*)Element, bWithDefault, ForProfile)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                  ,0x1d9,
                  "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                 );
  }
  if (Element->CheckSumStatus == 0) {
    eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output,
                           bForceWithoutMandatory,bWithDefault,ForProfile,(filepos_t *)Rendered_00);
    return eVar6;
  }
  local_70 = bWithDefault;
  bVar2 = Node_IsPartOf(Output,0x534d454d);
  local_68._Begin = (char *)0x0;
  local_68._Used = 0;
  if ((bVar2 != 0) || (bVar3 = ArrayResize(&local_68,(Element->Base).DataSize - 6,0), bVar3 != 0)) {
    Context = EBML_getContextEbmlCrc32();
    peVar4 = (ebml_crc *)EBML_ElementCreate(Element,Context,0,ForProfile);
    bVar3 = local_70;
    if (peVar4 != (ebml_crc *)0x0) {
      local_50 = peVar4;
      if (bVar2 == 0) {
        Output_00 = (stream *)NodeCreate(Element,0x534d454d);
        if (Output_00 == (stream *)0x0) {
          eVar6 = -2;
        }
        else {
          if (Output == (stream *)0x0) {
            __assert_fail("(const void*)(Output)!=NULL",
                          "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                          ,0x1fb,
                          "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                         );
          }
          local_78 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,0,1);
          local_78 = local_78 + 6;
          (**(code **)((long)(Output_00->Base).VMT + 0x20))
                    (Output_00,0x100,local_68._Begin,local_68._Used);
          (**(code **)((long)(Output_00->Base).VMT + 0x20))(Output_00,0x102,&local_78,8);
          eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output_00,
                                 bForceWithoutMandatory,local_70,ForProfile,(filepos_t *)Rendered_00
                                );
          peVar4 = local_50;
          if (eVar6 == 0) {
            if (*Rendered_00 != local_68._Used) {
              __assert_fail("Err!=ERR_NONE || *Rendered == (filepos_t)ARRAYCOUNT(TmpBuf,uint8_t)",
                            "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                            ,0x1ff,
                            "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                           );
            }
            EBML_CRCAddBuffer(local_50,local_68._Begin,*Rendered_00);
            EBML_CRCFinalize(peVar4);
            eVar6 = EBML_ElementRender(&peVar4->Base,Output,local_70,0,bForceWithoutMandatory,
                                       ForProfile,&local_48);
            if (eVar6 == 0) {
              eVar6 = (**(code **)((long)(Output->Base).VMT + 0x70))
                                (Output,local_68._Begin,local_68._Used,&local_40);
              if ((eVar6 == 0) && (local_40 != *Rendered_00)) {
                __assert_fail("Err!=ERR_NONE || (filepos_t)Written == *Rendered",
                              "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                              ,0x20a,
                              "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                             );
              }
              *Rendered_00 = local_40 + local_48;
            }
          }
          StreamClose(Output_00);
        }
      }
      else {
        if (Output == (stream *)0x0) {
          __assert_fail("(const void*)(Output)!=NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/libebml2/ebmlmaster.c"
                        ,0x213,
                        "err_t RenderData(ebml_master *, struct stream *, bool_t, bool_t, int, filepos_t *)"
                       );
        }
        lVar5 = (**(code **)((long)(Output->Base).VMT + 0x78))(Output,6,1);
        eVar6 = InternalRender((ebml_master *)(Element->Base).Base.Children,Output,
                               bForceWithoutMandatory,bVar3,ForProfile,(filepos_t *)Rendered_00);
        if (eVar6 == 0) {
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x102,&local_78,8);
          (**(code **)((long)(Output->Base).VMT + 0x18))(Output,0x101,&local_48);
          peVar4 = local_50;
          EBML_CRCAddBuffer(local_50,(void *)((lVar5 - local_78) + local_48),
                            (Element->Base).DataSize - 6);
          EBML_CRCFinalize(peVar4);
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar7 = EBML_ElementPositionData(&Element->Base);
          (*pcVar1)(Output,fVar7,0);
          eVar6 = EBML_ElementRender(&peVar4->Base,Output,local_70,0,bForceWithoutMandatory,
                                     ForProfile,&local_78);
          *Rendered_00 = *Rendered_00 + local_78;
          pcVar1 = *(code **)((long)(Output->Base).VMT + 0x78);
          fVar7 = EBML_ElementPositionEnd(&Element->Base);
          (*pcVar1)(Output,fVar7,0);
        }
      }
      NodeDelete((node *)local_50);
      goto LAB_0011c069;
    }
  }
  eVar6 = -2;
LAB_0011c069:
  ArrayClear(&local_68);
  return eVar6;
}

Assistant:

static err_t RenderData(ebml_binary *Element, struct stream *Output, bool_t UNUSED_PARAM(bForceWithoutMandatory), bool_t UNUSED_PARAM(bWithDefault), int UNUSED_PARAM(ForProfile), filepos_t *Rendered)
{
    size_t Written;
    err_t Err = Stream_Write(Output,ARRAYBEGIN(Element->Data,uint8_t),ARRAYCOUNT(Element->Data,uint8_t),&Written);
    if (Rendered)
        *Rendered = Written;
    return Err;
}